

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.hpp
# Opt level: O1

node * __thiscall
boost::lockfree::detail::
fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node,boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node,std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node>>>
::construct<true,true,depspawn::internal::TaskPool::Task*,unsigned_short>
          (fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node,boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node,std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node>>>
           *this,Task **arg1,unsigned_short *arg2)

{
  ushort uVar1;
  long lVar2;
  index_t iVar3;
  node *pnVar4;
  long lVar5;
  
  iVar3 = fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
          ::allocate_impl((fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
                           *)this);
  if (iVar3 == *(index_t *)(this + 8)) {
    pnVar4 = (node *)0x0;
  }
  else {
    lVar2 = *(long *)this;
    lVar5 = (ulong)iVar3 * 0x40;
    pnVar4 = (node *)(lVar2 + lVar5);
    uVar1 = *arg2;
    *(uint *)(lVar2 + lVar5) = (uint)uVar1;
    *(Task **)(lVar2 + 8 + lVar5) = *arg1;
    *(uint *)(lVar2 + lVar5) = (uint)uVar1 + (*(uint *)(lVar2 + lVar5) & 0xffff0000) + 0x10000;
  }
  return pnVar4;
}

Assistant:

T * construct (ArgumentType1 const & arg1, ArgumentType2 const & arg2)
    {
        index_t node_index = allocate<ThreadSafe>();
        if (node_index == null_handle())
            return NULL;

        T * node = NodeStorage::nodes() + node_index;
        new(node) T(arg1, arg2);
        return node;
    }